

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

void __thiscall Plan::Dump(Plan *this)

{
  _Rb_tree_node_base *p_Var1;
  
  printf("pending: %d\n",(ulong)(uint)(this->want_)._M_t._M_impl.super__Rb_tree_header._M_node_count
        );
  for (p_Var1 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->want_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(int *)&p_Var1[1]._M_parent != 0) {
      printf("want ");
    }
    Edge::Dump(*(Edge **)(p_Var1 + 1),"");
  }
  printf("ready: %d\n",(ulong)(uint)(this->ready_)._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  return;
}

Assistant:

void Plan::Dump() const {
  printf("pending: %d\n", (int)want_.size());
  for (map<Edge*, Want>::const_iterator e = want_.begin(); e != want_.end(); ++e) {
    if (e->second != kWantNothing)
      printf("want ");
    e->first->Dump();
  }
  printf("ready: %d\n", (int)ready_.size());
}